

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

char * testing::internal::ParseFlagValue(char *str,char *flag_name,bool def_optional)

{
  size_type *psVar1;
  size_type sVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char *pcVar6;
  string flag_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  size_type *local_70;
  size_type local_68;
  size_type local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (flag_name == (char *)0x0 || str == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"--","");
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_50,"gtest_");
    local_90._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == paVar5) {
      local_90.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_90.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_90._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_90,flag_name);
    local_70 = (size_type *)(pbVar4->_M_dataplus)._M_p;
    paVar5 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70 == paVar5) {
      local_60 = paVar5->_M_allocated_capacity;
      uStack_58 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_70 = &local_60;
    }
    else {
      local_60 = paVar5->_M_allocated_capacity;
    }
    local_68 = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    sVar2 = local_68;
    psVar1 = local_70;
    iVar3 = strncmp(str,(char *)local_70,local_68);
    if (iVar3 == 0) {
      pcVar6 = str + sVar2;
      if (((!def_optional) || (str[sVar2] != '\0')) && (pcVar6 = pcVar6 + 1, str[sVar2] != '=')) {
        pcVar6 = (char *)0x0;
      }
    }
    else {
      pcVar6 = (char *)0x0;
    }
    if (psVar1 != &local_60) {
      operator_delete(psVar1,local_60 + 1);
    }
  }
  return pcVar6;
}

Assistant:

static const char* ParseFlagValue(const char* str, const char* flag_name,
                                  bool def_optional) {
  // str and flag must not be NULL.
  if (str == nullptr || flag_name == nullptr) return nullptr;

  // The flag must start with "--" followed by GTEST_FLAG_PREFIX_.
  const std::string flag_str =
      std::string("--") + GTEST_FLAG_PREFIX_ + flag_name;
  const size_t flag_len = flag_str.length();
  if (strncmp(str, flag_str.c_str(), flag_len) != 0) return nullptr;

  // Skips the flag name.
  const char* flag_end = str + flag_len;

  // When def_optional is true, it's OK to not have a "=value" part.
  if (def_optional && (flag_end[0] == '\0')) {
    return flag_end;
  }

  // If def_optional is true and there are more characters after the
  // flag name, or if def_optional is false, there must be a '=' after
  // the flag name.
  if (flag_end[0] != '=') return nullptr;

  // Returns the string after "=".
  return flag_end + 1;
}